

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# general_attr.cpp
# Opt level: O2

void testAttrFloatVectors(string *tempdir)

{
  exr_result_t eVar1;
  exr_context_t ctxt;
  ostream *poVar2;
  char *pcVar3;
  char *in_RCX;
  char *pcVar4;
  exr_attr_float_vector_t local_48;
  exr_context_t f;
  float local_28 [4];
  
  ctxt = createDummyFile("<floatvector>");
  local_28[0] = 1.0;
  local_28[1] = 2.0;
  local_28[2] = 3.0;
  local_28[3] = 4.0;
  f = ctxt;
  if (ctxt == (exr_context_t)0x0) {
    eVar1 = 2;
  }
  else {
    eVar1 = (*ctxt->report_error)(ctxt,3,"Invalid reference to float vector object to initialize");
    if (eVar1 == 3) {
      pcVar4 = (char *)0xfffffffffffffffc;
      eVar1 = (*ctxt->print_error)
                        (ctxt,3,
                         "Received request to allocate negative sized float vector (%d entries)");
      if (eVar1 != 3) {
        poVar2 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,eVar1);
        poVar2 = std::operator<<(poVar2,") ");
        pcVar3 = (char *)exr_get_default_error_message(eVar1);
        poVar2 = std::operator<<(poVar2,pcVar3);
        poVar2 = std::operator<<(poVar2,"\n    expected: (");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,3);
        poVar2 = std::operator<<(poVar2,") ");
        pcVar3 = (char *)exr_get_default_error_message(3);
        poVar2 = std::operator<<(poVar2,pcVar3);
        std::endl<char,std::char_traits<char>>(poVar2);
        core_test_fail("exr_attr_float_vector_init (f, &fv, -4)",(char *)0x1d4,0x31a493,pcVar4);
      }
      eVar1 = (*ctxt->report_error)(ctxt,3,"Invalid (NULL) arguments to float vector create");
      if (eVar1 != 3) {
        poVar2 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,eVar1);
        poVar2 = std::operator<<(poVar2,") ");
        pcVar3 = (char *)exr_get_default_error_message(eVar1);
        poVar2 = std::operator<<(poVar2,pcVar3);
        poVar2 = std::operator<<(poVar2,"\n    expected: (");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,3);
        poVar2 = std::operator<<(poVar2,") ");
        pcVar3 = (char *)exr_get_default_error_message(3);
        poVar2 = std::operator<<(poVar2,pcVar3);
        std::endl<char,std::char_traits<char>>(poVar2);
        core_test_fail("exr_attr_float_vector_create (f, __null, fdata, 4)",(char *)0x1d7,0x31a493,
                       pcVar4);
      }
      eVar1 = (*ctxt->report_error)(ctxt,3,"Invalid (NULL) arguments to float vector create");
      if (eVar1 != 3) {
        poVar2 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,eVar1);
        poVar2 = std::operator<<(poVar2,") ");
        pcVar3 = (char *)exr_get_default_error_message(eVar1);
        poVar2 = std::operator<<(poVar2,pcVar3);
        poVar2 = std::operator<<(poVar2,"\n    expected: (");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,3);
        poVar2 = std::operator<<(poVar2,") ");
        pcVar3 = (char *)exr_get_default_error_message(3);
        poVar2 = std::operator<<(poVar2,pcVar3);
        std::endl<char,std::char_traits<char>>(poVar2);
        core_test_fail("exr_attr_float_vector_create (f, &fv, __null, 4)",(char *)0x1da,0x31a493,
                       pcVar4);
      }
      pcVar4 = (char *)0xfffffffffffffffc;
      eVar1 = (*ctxt->print_error)
                        (ctxt,3,
                         "Received request to allocate negative sized float vector (%d entries)");
      if (eVar1 != 3) {
        poVar2 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,eVar1);
        poVar2 = std::operator<<(poVar2,") ");
        pcVar3 = (char *)exr_get_default_error_message(eVar1);
        poVar2 = std::operator<<(poVar2,pcVar3);
        poVar2 = std::operator<<(poVar2,"\n    expected: (");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,3);
        poVar2 = std::operator<<(poVar2,") ");
        pcVar3 = (char *)exr_get_default_error_message(3);
        poVar2 = std::operator<<(poVar2,pcVar3);
        std::endl<char,std::char_traits<char>>(poVar2);
        core_test_fail("exr_attr_float_vector_create (f, &fv, fdata, -4)",(char *)0x1dd,0x31a493,
                       pcVar4);
      }
      local_48.length = 0;
      local_48.alloc_size = 0;
      local_48.arr = (float *)0x0;
      pcVar4 = (char *)0x3fffffff;
      eVar1 = (*ctxt->print_error)(ctxt,3,"Invalid too large size for float vector (%d entries)");
      if (eVar1 != 3) {
        poVar2 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,eVar1);
        poVar2 = std::operator<<(poVar2,") ");
        pcVar3 = (char *)exr_get_default_error_message(eVar1);
        poVar2 = std::operator<<(poVar2,pcVar3);
        poVar2 = std::operator<<(poVar2,"\n    expected: (");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,3);
        poVar2 = std::operator<<(poVar2,") ");
        pcVar3 = (char *)exr_get_default_error_message(3);
        poVar2 = std::operator<<(poVar2,pcVar3);
        std::endl<char,std::char_traits<char>>(poVar2);
        core_test_fail("exr_attr_float_vector_create (f, &fv, fdata, (2147483647) / 2)",
                       (char *)0x1e3,0x31a493,pcVar4);
      }
      eVar1 = (*ctxt->report_error)(ctxt,3,"Invalid reference to float vector object to initialize")
      ;
      if (eVar1 != 3) {
        poVar2 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,eVar1);
        poVar2 = std::operator<<(poVar2,") ");
        pcVar3 = (char *)exr_get_default_error_message(eVar1);
        poVar2 = std::operator<<(poVar2,pcVar3);
        poVar2 = std::operator<<(poVar2,"\n    expected: (");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,3);
        poVar2 = std::operator<<(poVar2,") ");
        pcVar3 = (char *)exr_get_default_error_message(3);
        poVar2 = std::operator<<(poVar2,pcVar3);
        std::endl<char,std::char_traits<char>>(poVar2);
        core_test_fail("exr_attr_float_vector_init_static (f, __null, fdata, 4)",(char *)0x1e6,
                       0x31a493,pcVar4);
      }
      eVar1 = (*ctxt->report_error)(ctxt,3,"Invalid reference to float array object to initialize");
      if (eVar1 != 3) {
        poVar2 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,eVar1);
        poVar2 = std::operator<<(poVar2,") ");
        pcVar3 = (char *)exr_get_default_error_message(eVar1);
        poVar2 = std::operator<<(poVar2,pcVar3);
        poVar2 = std::operator<<(poVar2,"\n    expected: (");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,3);
        poVar2 = std::operator<<(poVar2,") ");
        pcVar3 = (char *)exr_get_default_error_message(3);
        poVar2 = std::operator<<(poVar2,pcVar3);
        std::endl<char,std::char_traits<char>>(poVar2);
        core_test_fail("exr_attr_float_vector_init_static (f, &fv, __null, 4)",(char *)0x1e9,
                       0x31a493,pcVar4);
      }
      pcVar4 = (char *)0xfffffffffffffffc;
      eVar1 = (*ctxt->print_error)
                        (ctxt,3,
                         "Received request to allocate negative sized float vector (%d entries)");
      if (eVar1 != 3) {
        poVar2 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,eVar1);
        poVar2 = std::operator<<(poVar2,") ");
        pcVar3 = (char *)exr_get_default_error_message(eVar1);
        poVar2 = std::operator<<(poVar2,pcVar3);
        poVar2 = std::operator<<(poVar2,"\n    expected: (");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,3);
        poVar2 = std::operator<<(poVar2,") ");
        pcVar3 = (char *)exr_get_default_error_message(3);
        poVar2 = std::operator<<(poVar2,pcVar3);
        std::endl<char,std::char_traits<char>>(poVar2);
        core_test_fail("exr_attr_float_vector_init_static (f, &fv, fdata, -4)",(char *)0x1ec,
                       0x31a493,pcVar4);
      }
      eVar1 = exr_attr_float_vector_init(ctxt,&local_48,4);
      if (eVar1 != 0) {
        poVar2 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,eVar1);
        poVar2 = std::operator<<(poVar2,") ");
        pcVar3 = (char *)exr_get_default_error_message(eVar1);
        poVar2 = std::operator<<(poVar2,pcVar3);
        std::endl<char,std::char_traits<char>>(poVar2);
        core_test_fail("exr_attr_float_vector_init (f, &fv, 4)",(char *)0x1f3,0x31a493,pcVar4);
      }
      if (local_48.length != 4) {
        core_test_fail("fv.length == 4",(char *)0x1f4,0x31a493,pcVar4);
      }
      if (local_48.alloc_size != 4) {
        core_test_fail("fv.alloc_size == 4",(char *)0x1f5,0x31a493,pcVar4);
      }
      if (local_48.arr == (float *)0x0) {
        core_test_fail("fv.arr != __null",(char *)0x1f6,0x31a493,pcVar4);
      }
      (*ctxt->free_fn)(local_48.arr);
      local_48.length = 0;
      local_48.alloc_size = 0;
      local_48.arr = (float *)0x0;
      pcVar4 = (char *)0x4;
      eVar1 = exr_attr_float_vector_create(ctxt,&local_48,local_28,4);
      if (eVar1 != 0) {
        poVar2 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,eVar1);
        poVar2 = std::operator<<(poVar2,") ");
        pcVar3 = (char *)exr_get_default_error_message(eVar1);
        poVar2 = std::operator<<(poVar2,pcVar3);
        std::endl<char,std::char_traits<char>>(poVar2);
        core_test_fail("exr_attr_float_vector_create (f, &fv, fdata, 4)",(char *)0x1fc,0x31a493,
                       pcVar4);
      }
      if (local_48.length != 4) {
        core_test_fail("fv.length == 4",(char *)0x1fd,0x31a493,pcVar4);
      }
      if (local_48.alloc_size != 4) {
        core_test_fail("fv.alloc_size == 4",(char *)0x1fe,0x31a493,pcVar4);
      }
      if ((*local_48.arr == 1.0) && (!NAN(*local_48.arr))) {
        if ((local_48.arr[1] != 2.0) || (NAN(local_48.arr[1]))) {
          core_test_fail("fv.arr[1] == 2.f",(char *)0x200,0x31a493,pcVar4);
        }
        if ((local_48.arr[2] != 3.0) || (NAN(local_48.arr[2]))) {
          core_test_fail("fv.arr[2] == 3.f",(char *)0x201,0x31a493,pcVar4);
        }
        if ((local_48.arr[3] == 4.0) && (!NAN(local_48.arr[3]))) {
          (*ctxt->free_fn)(local_48.arr);
          local_48.length = 0;
          local_48.alloc_size = 0;
          local_48.arr = (float *)0x0;
          s_malloc_fail_on = 1;
          pcVar4 = (char *)0x4;
          eVar1 = exr_attr_float_vector_create(ctxt,&local_48,local_28,4);
          s_malloc_fail_on = 0;
          if (eVar1 != 1) {
            poVar2 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
            poVar2 = (ostream *)std::ostream::operator<<(poVar2,eVar1);
            poVar2 = std::operator<<(poVar2,") ");
            pcVar3 = (char *)exr_get_default_error_message(eVar1);
            poVar2 = std::operator<<(poVar2,pcVar3);
            poVar2 = std::operator<<(poVar2,"\n    expected: (");
            poVar2 = (ostream *)std::ostream::operator<<(poVar2,1);
            poVar2 = std::operator<<(poVar2,") ");
            pcVar3 = (char *)exr_get_default_error_message(1);
            poVar2 = std::operator<<(poVar2,pcVar3);
            std::endl<char,std::char_traits<char>>(poVar2);
            core_test_fail("exr_attr_float_vector_create (f, &fv, fdata, 4)",(char *)0x206,0x31a493,
                           pcVar4);
          }
          exr_print_context_info(ctxt,0);
          exr_print_context_info(ctxt,1);
          exr_finish(&f);
          return;
        }
        core_test_fail("fv.arr[3] == 4.f",(char *)0x202,0x31a493,pcVar4);
      }
      core_test_fail("fv.arr[0] == 1.f",(char *)0x1ff,0x31a493,pcVar4);
    }
  }
  poVar2 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,eVar1);
  poVar2 = std::operator<<(poVar2,") ");
  pcVar4 = (char *)exr_get_default_error_message(eVar1);
  poVar2 = std::operator<<(poVar2,pcVar4);
  poVar2 = std::operator<<(poVar2,"\n    expected: (");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,3);
  poVar2 = std::operator<<(poVar2,") ");
  pcVar4 = (char *)exr_get_default_error_message(3);
  poVar2 = std::operator<<(poVar2,pcVar4);
  std::endl<char,std::char_traits<char>>(poVar2);
  core_test_fail("exr_attr_float_vector_init (f, __null, 4)",(char *)0x1d0,0x31a493,in_RCX);
}

Assistant:

void
testAttrFloatVectors (const std::string& tempdir)
{
    // we no longer allow a null context as we need the memory allocator
    //testFloatVectorHelper (NULL);
    exr_context_t f = createDummyFile ("<floatvector>");
    testFloatVectorHelper (f);
    exr_print_context_info (f, 0);
    exr_print_context_info (f, 1);
    exr_finish (&f);
}